

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

void __thiscall cmListFileParser::~cmListFileParser(cmListFileParser *this)

{
  cmListFileLexer_Delete(this->Lexer);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
            (&this->FunctionArguments);
  std::__cxx11::string::~string((string *)&this->FunctionName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

cmListFileParser::~cmListFileParser()
{
  cmListFileLexer_Delete(this->Lexer);
}